

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O0

void tcp_connector(uv_loop_t *loop,uv_tcp_t *client,uv_connect_t *req)

{
  int iVar1;
  undefined1 local_30 [4];
  int r;
  sockaddr_in server_addr;
  uv_connect_t *req_local;
  uv_tcp_t *client_local;
  uv_loop_t *loop_local;
  
  server_addr.sin_zero = (uchar  [8])req;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_30);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
            ,0x51,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &server_addr)");
    abort();
  }
  iVar1 = uv_tcp_init(loop,client);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
            ,0x54,"r == 0");
    abort();
  }
  iVar1 = uv_tcp_connect(server_addr.sin_zero,client,local_30,on_connect);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
            ,0x5a,"r == 0");
    abort();
  }
  return;
}

Assistant:

static void tcp_connector(void) {
  struct sockaddr_in server_addr;
  struct sockaddr sockname;
  int r, namelen;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", server_port, &server_addr));

  r = uv_tcp_init(loop, &tcp);
  tcp.data = &connect_req;
  ASSERT(!r);

  r = uv_tcp_connect(&connect_req,
                     &tcp,
                     (const struct sockaddr*) &server_addr,
                     on_connect);
  ASSERT(!r);

  /* Fetch the actual port used by the connecting socket. */
  namelen = sizeof sockname;
  r = uv_tcp_getsockname(&tcp, &sockname, &namelen);
  ASSERT(!r);
  ASSERT(sockname.sa_family == AF_INET);
  connect_port = ntohs(((struct sockaddr_in*) &sockname)->sin_port);
  ASSERT(connect_port > 0);
}